

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
embree::ImageT<embree::Col3<unsigned_char>_>::ImageT
          (ImageT<embree::Col3<unsigned_char>_> *this,size_t width,size_t height,string *name)

{
  undefined1 auVar1 [16];
  size_t __n;
  Col3<unsigned_char> *__s;
  ulong uVar2;
  
  Image::Image(&this->super_Image,width,height,name);
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__ImageT_002aa188;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = height * width;
  __n = SUB168(auVar1 * ZEXT816(3),0);
  uVar2 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(3),8) == 0) {
    uVar2 = __n;
  }
  __s = (Col3<unsigned_char> *)operator_new__(uVar2);
  this->data = __s;
  memset(__s,0,__n);
  return;
}

Assistant:

ImageT (size_t width = 0, size_t height = 0, const std::string& name = "")
      : Image(width,height,name)
    {
      data = new T[width*height];
      memset((void*)data,0,width*height*sizeof(T));
    }